

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O1

void ihevcd_copy_pps(codec_t *ps_codec,WORD32 pps_id,WORD32 pps_id_ref)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pps_t *ppVar3;
  WORD16 *__dest;
  WORD16 *pWVar4;
  tile_t *ptVar5;
  long lVar6;
  pps_t *ppVar7;
  pps_t *ppVar8;
  undefined1 in_XMM0 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar1 = ps_codec->i4_wd;
  uVar2 = ps_codec->i4_ht;
  auVar9 = pmovsxbd(in_XMM0,0x3f3f3f3f);
  auVar10._0_4_ = uVar1 + auVar9._0_4_;
  auVar10._4_4_ = uVar2 + auVar9._4_4_;
  auVar10._8_4_ = auVar9._8_4_;
  auVar10._12_4_ = auVar9._12_4_;
  ppVar3 = ps_codec->ps_pps_base;
  __dest = ppVar3[pps_id].pi2_scaling_mat;
  pWVar4 = ppVar3[pps_id].pi2_scaling_mat;
  ptVar5 = ppVar3[pps_id].ps_tile;
  ppVar7 = ppVar3 + pps_id_ref;
  ppVar8 = ppVar3 + pps_id;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    ppVar8->pi2_scaling_mat = ppVar7->pi2_scaling_mat;
    ppVar7 = (pps_t *)&ppVar7->ps_tile;
    ppVar8 = (pps_t *)&ppVar8->ps_tile;
  }
  ppVar3[pps_id].pi2_scaling_mat = pWVar4;
  ppVar3[pps_id].ps_tile = ptVar5;
  memcpy(__dest,ppVar3[pps_id_ref].pi2_scaling_mat,0x1fc0);
  memcpy(ppVar3[pps_id].ps_tile,ppVar3[pps_id_ref].ps_tile,
         (long)(((int)(((uint)(auVar10._4_4_ >> 0x1f) >> 0x1a) + SUB164(auVar9 | auVar10,4)) >> 6) *
               ((int)(((uint)(auVar10._0_4_ >> 0x1f) >> 0x1a) + SUB164(auVar9 | auVar10,0)) >> 6)) *
         6);
  ppVar3[pps_id].i1_pps_valid = '\x01';
  (ps_codec->s_parse).ps_pps = ppVar3 + pps_id;
  return;
}

Assistant:

void ihevcd_copy_pps(codec_t *ps_codec, WORD32 pps_id, WORD32 pps_id_ref)
{
    pps_t *ps_pps, *ps_pps_ref;
    WORD16 *pi2_scaling_mat_backup;
    WORD32 scaling_mat_size;
    tile_t *ps_tile_backup;
    WORD32 max_tile_cols, max_tile_rows;
    WORD32 wd, ht;
    wd = ALIGN64(ps_codec->i4_wd);
    ht = ALIGN64(ps_codec->i4_ht);

    SCALING_MAT_SIZE(scaling_mat_size);
    max_tile_cols = (wd + MIN_TILE_WD - 1) / MIN_TILE_WD;
    max_tile_rows = (ht + MIN_TILE_HT - 1) / MIN_TILE_HT;

    ps_pps_ref = ps_codec->ps_pps_base + pps_id_ref;
    ps_pps = ps_codec->ps_pps_base + pps_id;

    pi2_scaling_mat_backup = ps_pps->pi2_scaling_mat;
    ps_tile_backup = ps_pps->ps_tile;

    memcpy(ps_pps, ps_pps_ref, sizeof(pps_t));
    ps_pps->pi2_scaling_mat = pi2_scaling_mat_backup;
    ps_pps->ps_tile = ps_tile_backup;
    memcpy(ps_pps->pi2_scaling_mat, ps_pps_ref->pi2_scaling_mat, scaling_mat_size * sizeof(WORD16));
    memcpy(ps_pps->ps_tile, ps_pps_ref->ps_tile, max_tile_cols * max_tile_rows * sizeof(tile_t));

    ps_pps->i1_pps_valid = 1;

    ps_codec->s_parse.ps_pps = ps_pps;
}